

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O2

void __thiscall FailableMemoryAllocator::checkAllFailedAllocsWereDone(FailableMemoryAllocator *this)

{
  LocationToFailAllocNode *pLVar1;
  UtestShell *this_00;
  char *fileName;
  size_t lineNumber;
  SimpleString failText;
  SimpleString SStack_98;
  undefined1 local_88 [16];
  TestFailure local_78;
  
  if (this->head_ != (LocationToFailAllocNode *)0x0) {
    this_00 = UtestShell::getCurrent();
    SimpleString::SimpleString(&SStack_98,"");
    pLVar1 = this->head_;
    if (pLVar1->file_ == (char *)0x0) {
      StringFromFormat(local_88 + 0x10,"Expected allocation number %d was never done",
                       (ulong)(uint)pLVar1->allocNumberToFail_);
      SimpleString::operator=(&SStack_98,(SimpleString *)(local_88 + 0x10));
    }
    else {
      StringFromFormat(local_88 + 0x10,"Expected failing alloc at %s:%d was never done",
                       pLVar1->file_,(ulong)(uint)pLVar1->line_);
      SimpleString::operator=(&SStack_98,(SimpleString *)(local_88 + 0x10));
    }
    SimpleString::~SimpleString((SimpleString *)(local_88 + 0x10));
    UtestShell::getName((UtestShell *)local_88);
    fileName = SimpleString::asCharString((SimpleString *)local_88);
    lineNumber = UtestShell::getLineNumber(this_00);
    FailFailure::FailFailure
              ((FailFailure *)(local_88 + 0x10),this_00,fileName,lineNumber,&SStack_98);
    (*this_00->_vptr_UtestShell[0x26])(this_00,local_88 + 0x10);
    TestFailure::~TestFailure((TestFailure *)(local_88 + 0x10));
    SimpleString::~SimpleString((SimpleString *)local_88);
    SimpleString::~SimpleString(&SStack_98);
  }
  return;
}

Assistant:

void FailableMemoryAllocator::checkAllFailedAllocsWereDone()
{
    if (head_) {
        UtestShell* currentTest = UtestShell::getCurrent();
        SimpleString failText;
        if (head_->file_)
            failText = StringFromFormat("Expected failing alloc at %s:%d was never done", head_->file_, (int) head_->line_);
        else
            failText = StringFromFormat("Expected allocation number %d was never done", (int) head_->allocNumberToFail_);

        currentTest->failWith(FailFailure(currentTest, currentTest->getName().asCharString(), currentTest->getLineNumber(), failText));
    }
}